

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O2

bool __thiscall Clasp::Solver::ccMinRecurse(Solver *this,CCMinRecursive *ccMin,Literal p)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  
  uVar1 = *(uint *)((long)(this->epoch_).ebo_.buf + (ulong)(p.rep_ & 0xfffffffc));
  uVar2 = ccMin->open;
  if (uVar1 <= uVar2) {
    CCMinRecursive::push(ccMin,(Literal)(p.rep_ & 0xfffffffe));
  }
  iVar3 = uVar1 - uVar2;
  if (uVar1 < uVar2) {
    iVar3 = 0;
  }
  return iVar3 != 2;
}

Assistant:

void Solver::updateVars() {
	if (numVars() > shared_->numVars()) {
		popVars(numVars() - shared_->numVars(), false, 0);
	}
	else {
		assign_.resize(shared_->numVars() + 1);
		watches_.resize(assign_.numVars()<<1);
	}
}